

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O0

void __thiscall Js::Profiler::Merge(Profiler *this,Profiler *profiler)

{
  int iVar1;
  TimeEntry *pTVar2;
  TimeEntry item;
  TimeEntry entry_00;
  TimeEntry item_00;
  TimeEntry *entry;
  undefined1 local_160 [8];
  FixedStack<Js::TimeEntry,_20> reverseStack;
  Profiler *profiler_local;
  Profiler *this_local;
  
  reverseStack._320_8_ = profiler;
  MergeTree(this,&this->rootNode,&profiler->rootNode);
  iVar1 = FixedStack<Js::TimeEntry,_20>::Count
                    ((FixedStack<Js::TimeEntry,_20> *)reverseStack._320_8_);
  if (1 < iVar1) {
    FixedStack<Js::TimeEntry,_20>::FixedStack((FixedStack<Js::TimeEntry,_20> *)local_160);
    do {
      pTVar2 = FixedStack<Js::TimeEntry,_20>::Pop
                         ((FixedStack<Js::TimeEntry,_20> *)reverseStack._320_8_);
      item._0_8_ = *(ulong *)pTVar2 & 0xffff;
      item.time = pTVar2->time;
      FixedStack<Js::TimeEntry,_20>::Push((FixedStack<Js::TimeEntry,_20> *)local_160,item);
      iVar1 = FixedStack<Js::TimeEntry,_20>::Count
                        ((FixedStack<Js::TimeEntry,_20> *)reverseStack._320_8_);
    } while (1 < iVar1);
    do {
      pTVar2 = FixedStack<Js::TimeEntry,_20>::Pop((FixedStack<Js::TimeEntry,_20> *)local_160);
      entry_00._0_8_ = *(ulong *)pTVar2 & 0xffff;
      entry_00.time = pTVar2->time;
      Push(this,entry_00);
      item_00._0_8_ = *(ulong *)pTVar2 & 0xffff;
      item_00.time = pTVar2->time;
      FixedStack<Js::TimeEntry,_20>::Push
                ((FixedStack<Js::TimeEntry,_20> *)reverseStack._320_8_,item_00);
      iVar1 = FixedStack<Js::TimeEntry,_20>::Count((FixedStack<Js::TimeEntry,_20> *)local_160);
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void
    Profiler::Merge(Profiler * profiler)
    {
        MergeTree(&rootNode, &profiler->rootNode);
        if (profiler->timeStack.Count() > 1)
        {
            FixedStack<TimeEntry, MaxStackDepth> reverseStack;
            do
            {
                reverseStack.Push(*profiler->timeStack.Pop());
            }
            while (profiler->timeStack.Count() > 1);

            do
            {
                TimeEntry * entry = reverseStack.Pop();
                this->Push(*entry);
                profiler->timeStack.Push(*entry);
            }
            while (reverseStack.Count() != 0);
        }
    }